

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

xmlDictEntry *
xmlDictLookupInternal(xmlDictPtr dict,xmlChar *prefix,xmlChar *name,int maybeLen,int update)

{
  _xmlDict *p_Var1;
  xmlChar *pxVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  xmlDictEntry *__src;
  xmlDictEntry *pxVar7;
  xmlChar *pxVar8;
  ulong uVar9;
  xmlDictEntry *pxVar10;
  uint uVar11;
  ulong uVar12;
  xmlDictEntry *pxVar13;
  int found;
  size_t len;
  size_t plen;
  int local_5c;
  uint local_58;
  undefined4 uStack_54;
  uint local_4c;
  uint local_48;
  undefined4 uStack_44;
  _xmlDict *local_40;
  xmlDictEntry *local_38;
  
  local_5c = 0;
  if (name != (xmlChar *)0x0 && dict != (xmlDictPtr)0x0) {
    if (prefix == (xmlChar *)0x0) {
      iVar5 = -1;
      if (-1 < maybeLen) {
        iVar5 = maybeLen;
      }
      local_4c = xmlDictHashName(dict->seed,name,(long)iVar5,(size_t *)&local_58);
      uVar9 = CONCAT44(uStack_54,local_58);
      uVar12 = uVar9;
      if (0x3fffffff < uVar9) {
        return (xmlDictEntry *)0x0;
      }
    }
    else {
      local_4c = xmlDictHashQName(dict->seed,prefix,name,(size_t *)&local_48,(size_t *)&local_58);
      uVar9 = CONCAT44(uStack_54,local_58);
      if (0x3fffffff < uVar9) {
        return (xmlDictEntry *)0x0;
      }
      if (0x3fffffff - uVar9 <= CONCAT44(uStack_44,local_48)) {
        return (xmlDictEntry *)0x0;
      }
      uVar12 = CONCAT44(uStack_44,local_48) + uVar9 + 1;
    }
    if (uVar12 <= dict->limit - 1) {
      if (dict->size == 0) {
        __src = (xmlDictEntry *)0x0;
      }
      else {
        __src = xmlDictFindEntry(dict,prefix,name,(int)uVar12,local_4c,&local_5c);
        if (local_5c != 0) {
          return __src;
        }
      }
      p_Var1 = dict->subdict;
      if ((p_Var1 != (_xmlDict *)0x0) && (p_Var1->size != 0)) {
        local_40 = p_Var1;
        local_38 = __src;
        if (prefix == (xmlChar *)0x0) {
          uVar4 = xmlDictHashName(p_Var1->seed,name,uVar9,(size_t *)&local_58);
          pxVar8 = (xmlChar *)0x0;
        }
        else {
          uVar4 = xmlDictHashQName(p_Var1->seed,prefix,name,(size_t *)&local_48,(size_t *)&local_58)
          ;
          pxVar8 = prefix;
        }
        pxVar7 = xmlDictFindEntry(local_40,pxVar8,name,(int)uVar12,uVar4,&local_5c);
        __src = local_38;
        if (local_5c != 0) {
          return pxVar7;
        }
      }
      if (update != 0) {
        uVar9 = dict->size;
        if ((uVar9 & 0xfffffffffffffff8) - (uVar9 >> 3) < (ulong)(dict->nbElems + 1)) {
          if (uVar9 == 0) {
            uVar4 = 8;
          }
          else {
            if (0x7fffffff < uVar9) {
              return (xmlDictEntry *)0x0;
            }
            uVar4 = (int)uVar9 * 2;
          }
          iVar5 = xmlDictGrow(dict,uVar4);
          if (iVar5 != 0) {
            return (xmlDictEntry *)0x0;
          }
          uVar6 = (int)dict->size - 1;
          uVar9 = (ulong)(uVar6 & local_4c);
          pxVar7 = dict->table;
          __src = pxVar7 + uVar9;
          uVar4 = pxVar7[uVar9].hashValue;
          if (uVar4 != 0) {
            uVar11 = 0;
            do {
              if (((int)uVar9 - uVar4 & uVar6) < uVar11) break;
              uVar11 = uVar11 + 1;
              uVar4 = (int)uVar9 + 1;
              uVar9 = (ulong)uVar4;
              __src = __src + 1;
              if ((uVar4 & uVar6) == 0) {
                __src = pxVar7;
              }
              uVar4 = __src->hashValue;
            } while (uVar4 != 0);
          }
        }
        if (prefix == (xmlChar *)0x0) {
          pxVar8 = xmlDictAddString(dict,name,local_58);
        }
        else {
          pxVar8 = xmlDictAddQString(dict,prefix,local_48,name,local_58);
        }
        uVar4 = local_4c;
        if (pxVar8 != (xmlChar *)0x0) {
          if (__src->hashValue != 0) {
            pxVar7 = dict->table;
            pxVar13 = pxVar7 + dict->size;
            pxVar10 = __src;
            do {
              pxVar10 = pxVar10 + 1;
              if (pxVar13 <= pxVar10) {
                pxVar10 = pxVar7;
              }
            } while (pxVar10->hashValue != 0);
            if (pxVar10 < __src) {
              memmove(pxVar7 + 1,pxVar7,(long)pxVar10 - (long)pxVar7);
              pxVar7 = dict->table;
              uVar3 = *(undefined4 *)&pxVar13[-1].field_0x4;
              pxVar2 = pxVar13[-1].name;
              pxVar10 = pxVar13 + -1;
              pxVar7->hashValue = pxVar13[-1].hashValue;
              *(undefined4 *)&pxVar7->field_0x4 = uVar3;
              pxVar7->name = pxVar2;
            }
            memmove(__src + 1,__src,(long)pxVar10 - (long)__src);
          }
          __src->hashValue = uVar4;
          __src->name = pxVar8;
          dict->nbElems = dict->nbElems + 1;
          return __src;
        }
      }
    }
  }
  return (xmlDictEntry *)0x0;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static const xmlDictEntry *
xmlDictLookupInternal(xmlDictPtr dict, const xmlChar *prefix,
                      const xmlChar *name, int maybeLen, int update) {
    xmlDictEntry *entry = NULL;
    const xmlChar *ret;
    unsigned hashValue;
    size_t maxLen, len, plen, klen;
    int found = 0;

    if ((dict == NULL) || (name == NULL))
	return(NULL);

    maxLen = (maybeLen < 0) ? SIZE_MAX : (size_t) maybeLen;

    if (prefix == NULL) {
        hashValue = xmlDictHashName(dict->seed, name, maxLen, &len);
        if (len > INT_MAX / 2)
            return(NULL);
        klen = len;
    } else {
        hashValue = xmlDictHashQName(dict->seed, prefix, name, &plen, &len);
        if ((len > INT_MAX / 2) || (plen >= INT_MAX / 2 - len))
            return(NULL);
        klen = plen + 1 + len;
    }

    if ((dict->limit > 0) && (klen >= dict->limit))
        return(NULL);

    /*
     * Check for an existing entry
     */
    if (dict->size > 0)
        entry = xmlDictFindEntry(dict, prefix, name, klen, hashValue, &found);
    if (found)
        return(entry);

    if ((dict->subdict != NULL) && (dict->subdict->size > 0)) {
        xmlDictEntry *subEntry;
        unsigned subHashValue;

        if (prefix == NULL)
            subHashValue = xmlDictHashName(dict->subdict->seed, name, len,
                                           &len);
        else
            subHashValue = xmlDictHashQName(dict->subdict->seed, prefix, name,
                                            &plen, &len);
        subEntry = xmlDictFindEntry(dict->subdict, prefix, name, klen,
                                    subHashValue, &found);
        if (found)
            return(subEntry);
    }

    if (!update)
        return(NULL);

    /*
     * Grow the hash table if needed
     */
    if (dict->nbElems + 1 > dict->size / MAX_FILL_DENOM * MAX_FILL_NUM) {
        unsigned newSize, mask, displ, pos;

        if (dict->size == 0) {
            newSize = MIN_HASH_SIZE;
        } else {
            if (dict->size >= MAX_HASH_SIZE)
                return(NULL);
            newSize = dict->size * 2;
        }
        if (xmlDictGrow(dict, newSize) != 0)
            return(NULL);

        /*
         * Find new entry
         */
        mask = dict->size - 1;
        displ = 0;
        pos = hashValue & mask;
        entry = &dict->table[pos];

        while ((entry->hashValue != 0) &&
               ((pos - entry->hashValue) & mask) >= displ) {
            displ++;
            pos++;
            entry++;
            if ((pos & mask) == 0)
                entry = dict->table;
        }
    }

    if (prefix == NULL)
        ret = xmlDictAddString(dict, name, len);
    else
        ret = xmlDictAddQString(dict, prefix, plen, name, len);
    if (ret == NULL)
        return(NULL);

    /*
     * Shift the remainder of the probe sequence to the right
     */
    if (entry->hashValue != 0) {
        const xmlDictEntry *end = &dict->table[dict->size];
        const xmlDictEntry *cur = entry;

        do {
            cur++;
            if (cur >= end)
                cur = dict->table;
        } while (cur->hashValue != 0);

        if (cur < entry) {
            /*
             * If we traversed the end of the buffer, handle the part
             * at the start of the buffer.
             */
            memmove(&dict->table[1], dict->table,
                    (char *) cur - (char *) dict->table);
            cur = end - 1;
            dict->table[0] = *cur;
        }

        memmove(&entry[1], entry, (char *) cur - (char *) entry);
    }

    /*
     * Populate entry
     */
    entry->hashValue = hashValue;
    entry->name = ret;

    dict->nbElems++;

    return(entry);
}